

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZWavyLine.h
# Opt level: O0

void __thiscall pzgeom::TPZWavyLine::SetData(TPZWavyLine *this,TPZVec<double> *wavedir,int numwaves)

{
  undefined4 in_EDX;
  TPZManVector<double,_3> *in_RDI;
  TPZManVector<double,_3> *in_stack_ffffffffffffffa8;
  TPZManVector<double,_3> *in_stack_ffffffffffffffb0;
  TPZVec<double> *in_stack_ffffffffffffffc8;
  TPZManVector<double,_3> *in_stack_ffffffffffffffd0;
  
  TPZManVector<double,_3>::TPZManVector(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  TPZManVector<double,_3>::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  TPZManVector<double,_3>::~TPZManVector(in_RDI);
  *(undefined4 *)&(in_RDI->super_TPZVec<double>).fNAlloc = in_EDX;
  return;
}

Assistant:

void SetData(TPZVec<REAL> &wavedir, int numwaves)
        {
#ifdef PZDEBUG
            if (wavedir.size() != 3) {
                DebugStop();
            }
#endif
            fWaveDir = wavedir;
            fNumWaves = numwaves;
        }